

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_decl_reset(CPDecl *decl)

{
  uint uVar1;
  
  uVar1 = decl->specpos;
  decl->pos = uVar1;
  decl->top = uVar1 + 1;
  decl->stack[uVar1].next = 0;
  decl->attr = decl->specattr;
  decl->fattr = decl->specfattr;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  return;
}

Assistant:

static void cp_decl_reset(CPDecl *decl)
{
  decl->pos = decl->specpos;
  decl->top = decl->specpos+1;
  decl->stack[decl->specpos].next = 0;
  decl->attr = decl->specattr;
  decl->fattr = decl->specfattr;
  decl->name = NULL;
  decl->redir = NULL;
}